

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WheatsheafAndWheatsheafMean
          (aggreports *this,vector<int,_std::allocator<int>_> *handles,
          offset_in_OutLosses_to_subr GetOutLoss,int epcalc,int eptype,int eptype_tvar,
          int ensemble_id)

{
  float fVar1;
  bool *pbVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  outkey2 oVar5;
  pointer piVar6;
  undefined8 this_00;
  int iVar7;
  bool bVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  reference pvVar11;
  reference ppVar12;
  reference piVar13;
  const_reference pvVar14;
  reference piVar15;
  mapped_type_conflict2 *pmVar16;
  reference ppVar17;
  reference pfVar18;
  mapped_type *pmVar19;
  reference pvVar20;
  undefined4 in_register_0000000c;
  long *plVar21;
  OASIS_FLOAT OVar22;
  int in_stack_00000010;
  code *local_318;
  code *local_2f8;
  undefined1 local_2c0 [8];
  vector<int,_std::allocator<int>_> fileIDs;
  iterator iStack_2a0;
  float lp;
  iterator __end2_2;
  iterator __begin2_2;
  lossvec *__range2_2;
  undefined1 local_280 [4];
  int i;
  undefined1 local_278 [16];
  lossvec *lpv;
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> s;
  iterator __end1_1;
  iterator __begin1_1;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  *__range1_1;
  vector<float,_std::allocator<float>_> local_228;
  _Self local_210;
  _Self local_208;
  iterator it;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  mean_map;
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> x_2;
  iterator __end1;
  iterator __begin1;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  *__range1;
  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  maxCount;
  undefined1 local_160 [8];
  vector<int,_std::allocator<int>_> fileIDs_1;
  pair<const_outkey2,_OutLosses> x_1;
  _Self local_108;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  iterator iStack_d0;
  int sidx;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  pair<const_outkey2,_OutLosses> x;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int local_74;
  undefined1 local_70 [4];
  int samplesize;
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  items;
  int eptype_local;
  int epcalc_local;
  offset_in_OutLosses_to_subr GetOutLoss_local;
  vector<int,_std::allocator<int>_> *handles_local;
  aggreports *this_local;
  
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = eptype_tvar;
  items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = eptype;
  std::
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::map((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
         *)local_70);
  if (in_stack_00000010 == 0) {
    local_74 = this->samplesize_;
    pvVar11 = std::
              vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
              ::operator[](this->out_loss_,1);
    __end2_1 = std::
               map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
               ::begin(pvVar11);
    local_108._M_node =
         (_Base_ptr)
         std::
         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
         ::end(pvVar11);
    while (bVar8 = std::operator!=(&__end2_1,&local_108), bVar8) {
      ppVar12 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end2_1);
      x_1.first.sidx = (int)(ppVar12->second).max_out_loss;
      piVar6 = *(pointer *)&ppVar12->first;
      x_1.first.summary_id = (ppVar12->first).sidx;
      oVar5 = ppVar12->first;
      x_1.first.period_no = (int)(ppVar12->second).agg_out_loss;
      plVar21 = (long *)((long)&x_1.first.period_no + CONCAT44(in_register_0000000c,epcalc));
      local_318 = (code *)GetOutLoss;
      if ((GetOutLoss & 1) != 0) {
        local_318 = *(code **)(*plVar21 + (GetOutLoss - 1));
      }
      OVar22 = (OASIS_FLOAT)(*local_318)(plVar21);
      fileIDs_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = piVar6;
      FillWheatsheafItems(this,oVar5,
                          (map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                           *)local_70,OVar22);
      std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end2_1);
    }
  }
  else {
    pmVar9 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->ensembletosidx_,&stack0x00000010);
    sVar10 = std::vector<int,_std::allocator<int>_>::size(pmVar9);
    local_74 = (int)sVar10;
    pvVar11 = std::
              vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
              ::operator[](this->out_loss_,1);
    __end2 = std::
             map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
             ::begin(pvVar11);
    register0x00000000 =
         std::
         map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>
         ::end(pvVar11);
    while (bVar8 = std::operator!=(&__end2,(_Self *)&x.second.max_out_loss), bVar8) {
      ppVar12 = std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator*(&__end2);
      x.first.sidx = (int)(ppVar12->second).max_out_loss;
      uVar3 = (ppVar12->first).summary_id;
      uVar4 = (ppVar12->first).period_no;
      oVar5.period_no = uVar4;
      oVar5.summary_id = uVar3;
      x.first._0_8_ = *(undefined8 *)&(ppVar12->first).sidx;
      pmVar9 = std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](&this->ensembletosidx_,&stack0x00000010);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pmVar9);
      iStack_d0 = std::vector<int,_std::allocator<int>_>::end(pmVar9);
      while (bVar8 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff30), bVar8) {
        piVar13 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3);
        iVar7 = x.first.summary_id;
        if (x.first.summary_id == *piVar13) {
          plVar21 = (long *)((long)&x.first.period_no + CONCAT44(in_register_0000000c,epcalc));
          local_2f8 = (code *)GetOutLoss;
          if ((GetOutLoss & 1) != 0) {
            local_2f8 = *(code **)(*plVar21 + (GetOutLoss - 1));
          }
          OVar22 = (OASIS_FLOAT)(*local_2f8)(plVar21);
          oVar5.sidx = iVar7;
          FillWheatsheafItems(this,oVar5,
                              (map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                               *)local_70,OVar22);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      std::_Rb_tree_iterator<std::pair<const_outkey2,_OutLosses>_>::operator++(&__end2);
    }
  }
  pbVar2 = this->outputFlags_;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](handles,0);
  if ((pbVar2[*pvVar14] & 1U) == 1) {
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](handles,0);
    GetFileIDs((vector<int,_std::allocator<int>_> *)local_160,this,*pvVar14,1);
    WritePerSampleExceedanceProbabilityTable
              (this,(vector<int,_std::allocator<int>_> *)local_160,
               (map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)local_70,(int)items._M_t._M_impl.super__Rb_tree_header._M_node_count,ensemble_id);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_160);
  }
  pbVar2 = this->outputFlags_;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](handles,1);
  if ((pbVar2[*pvVar14] & 1U) == 0) {
    maxCount._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  else {
    std::
    map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
    map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
         *)&__range1);
    __end1 = std::
             map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
             ::begin((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                      *)local_70);
    x_2.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::end((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                         *)local_70);
    while (bVar8 = std::operator!=(&__end1,(_Self *)&x_2.second.
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
          , bVar8) {
      ppVar17 = std::
                _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>
                ::operator*(&__end1);
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)
                 &mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count,ppVar17);
      sVar10 = std::vector<float,_std::allocator<float>_>::size
                         ((vector<float,_std::allocator<float>_> *)&x_2);
      pmVar16 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)&__range1,
                             (key_type *)&mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      if (*pmVar16 < sVar10) {
        sVar10 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)&x_2);
        pmVar16 = std::
                  map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                  ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                                *)&__range1,
                               (key_type *)
                               &mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        *pmVar16 = sVar10;
      }
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::~pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)
                 &mean_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>::
      operator++(&__end1);
    }
    std::
    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
           *)&it);
    local_208._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->summaryids_);
    while( true ) {
      local_210._M_node =
           (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->summaryids_);
      bVar8 = std::operator!=(&local_208,&local_210);
      if (!bVar8) break;
      piVar15 = std::_Rb_tree_const_iterator<int>::operator*(&local_208);
      pmVar16 = std::
                map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                ::operator[]((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
                              *)&__range1,piVar15);
      sVar10 = *pmVar16;
      __range1_1._4_4_ = 0;
      std::allocator<float>::allocator((allocator<float> *)((long)&__range1_1 + 3));
      std::vector<float,_std::allocator<float>_>::vector
                (&local_228,sVar10,(value_type_conflict2 *)((long)&__range1_1 + 4),
                 (allocator<float> *)((long)&__range1_1 + 3));
      piVar15 = std::_Rb_tree_const_iterator<int>::operator*(&local_208);
      pmVar19 = std::
                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                              *)&it,piVar15);
      std::vector<float,_std::allocator<float>_>::operator=(pmVar19,&local_228);
      std::vector<float,_std::allocator<float>_>::~vector(&local_228);
      std::allocator<float>::~allocator((allocator<float> *)((long)&__range1_1 + 3));
      std::_Rb_tree_const_iterator<int>::operator++(&local_208);
    }
    __end1_1 = std::
               map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::begin((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                        *)local_70);
    s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::end((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
                         *)local_70);
    while (bVar8 = std::operator!=(&__end1_1,
                                   (_Self *)&s.second.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage),
          bVar8) {
      ppVar17 = std::
                _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>
                ::operator*(&__end1_1);
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)&lpv,ppVar17);
      local_278._8_8_ = &s;
      std::vector<float,_std::allocator<float>_>::rbegin
                ((vector<float,_std::allocator<float>_> *)local_278);
      std::vector<float,_std::allocator<float>_>::rend
                ((vector<float,_std::allocator<float>_> *)local_280);
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
                  *)local_278,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
                  *)local_280);
      this_00 = local_278._8_8_;
      __range2_2._4_4_ = 0;
      __end2_2 = std::vector<float,_std::allocator<float>_>::begin
                           ((vector<float,_std::allocator<float>_> *)local_278._8_8_);
      iStack_2a0 = std::vector<float,_std::allocator<float>_>::end
                             ((vector<float,_std::allocator<float>_> *)this_00);
      while (bVar8 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffd60), bVar8) {
        pfVar18 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                  ::operator*(&__end2_2);
        fVar1 = *pfVar18;
        fileIDs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ = fVar1;
        pmVar19 = std::
                  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)&it,(key_type *)&lpv);
        pvVar20 = std::vector<float,_std::allocator<float>_>::operator[]
                            (pmVar19,(long)__range2_2._4_4_);
        *pvVar20 = fVar1 + *pvVar20;
        __range2_2._4_4_ = __range2_2._4_4_ + 1;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&__end2_2);
      }
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::~pair
                ((pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)&lpv);
      std::
      _Rb_tree_iterator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>::
      operator++(&__end1_1);
    }
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](handles,1);
    GetFileIDs((vector<int,_std::allocator<int>_> *)local_2c0,this,*pvVar14,0);
    WriteExceedanceProbabilityTable
              (this,(vector<int,_std::allocator<int>_> *)local_2c0,
               (map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)&it,(double)this->totalperiods_,
               items._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
               (int)items._M_t._M_impl.super__Rb_tree_header._M_node_count,ensemble_id,local_74);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_2c0);
    std::
    map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~map((map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
            *)&it);
    std::
    map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>::
    ~map((map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
          *)&__range1);
    maxCount._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  }
  std::
  map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::~map((map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
          *)local_70);
  return;
}

Assistant:

void aggreports::WheatsheafAndWheatsheafMean(const std::vector<int> handles,
				OASIS_FLOAT (OutLosses::*GetOutLoss)(),
				const int epcalc, const int eptype,
				const int eptype_tvar, int ensemble_id) {

  std::map<wheatkey, lossvec> items;
  int samplesize;

  if (ensemble_id != 0) {
    samplesize = (int)ensembletosidx_[ensemble_id].size();
    for (auto x : (*out_loss_)[SAMPLES]) {
      for (auto sidx : ensembletosidx_[ensemble_id]) {
	if (x.first.sidx == sidx) {
	  FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
	}
      }
    }
  } else {
    samplesize = samplesize_;
    for (auto x : (*out_loss_)[SAMPLES]) {
      FillWheatsheafItems(x.first, items, (x.second.*GetOutLoss)());
    }
  }

  if (outputFlags_[handles[WHEATSHEAF]] == true) {
    std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF], PSEPT);
    WritePerSampleExceedanceProbabilityTable(fileIDs, items, eptype,
					     eptype_tvar);
  }

  if (outputFlags_[handles[WHEATSHEAF_MEAN]] == false) return;

  std::map<int, size_t> maxCount;
  for (auto x : items) {
    if (x.second.size() > maxCount[x.first.summary_id]) {
      maxCount[x.first.summary_id] = x.second.size();
    }
  }

  std::map<int, lossvec> mean_map;
  for (std::set<int>::iterator it = summaryids_.begin();
       it != summaryids_.end(); ++it) {
    mean_map[*it] = lossvec(maxCount[*it], 0);
  }

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    int i = 0;
    for (auto lp : lpv) {
      mean_map[s.first.summary_id][i] += lp;
      i++;
    }
  }

  std::vector<int> fileIDs = GetFileIDs(handles[WHEATSHEAF_MEAN]);
  WriteExceedanceProbabilityTable(fileIDs, mean_map, totalperiods_, epcalc,
				  eptype, eptype_tvar, samplesize);

}